

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

int Js::VariableWalkerBase::GetReturnedValueCount(DiagStackFrame *frame)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DebugContext *pDVar5;
  ReturnedValueList *pRVar6;
  
  if (frame == (DiagStackFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x138,"(frame)","frame");
    if (!bVar2) goto LAB_007e66c1;
    *puVar4 = 0;
  }
  iVar3 = (*frame->_vptr_DiagStackFrame[10])(frame);
  if (CONCAT44(extraout_var,iVar3) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x139,"(frame->GetScriptContext())","frame->GetScriptContext()");
    if (!bVar2) {
LAB_007e66c1:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  iVar3 = (*frame->_vptr_DiagStackFrame[10])(frame);
  pDVar5 = ScriptContext::GetDebugContext((ScriptContext *)CONCAT44(extraout_var_00,iVar3));
  pRVar6 = ProbeContainer::GetReturnedValueList(pDVar5->diagProbesContainer);
  iVar3 = 0;
  if (pRVar6 != (ReturnedValueList *)0x0) {
    bVar2 = DiagStackFrame::IsTopFrame(frame);
    iVar3 = 0;
    if (bVar2) {
      iVar3 = (pRVar6->super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).
              count;
    }
  }
  return iVar3;
}

Assistant:

int  VariableWalkerBase::GetReturnedValueCount(DiagStackFrame* frame)
    {
        Assert(frame);
        Assert(frame->GetScriptContext());

        ReturnedValueList *returnedValueList = frame->GetScriptContext()->GetDebugContext()->GetProbeContainer()->GetReturnedValueList();
        return returnedValueList != nullptr && frame->IsTopFrame() ? returnedValueList->Count() : 0;
    }